

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O0

err_t bignIdSign(octet *id_sig,bign_params *params,octet *oid_der,size_t oid_len,octet *id_hash,
                octet *hash,octet *id_privkey,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  word *a;
  word *mod;
  gen_i b;
  gen_i dest;
  word wVar5;
  word *in_RCX;
  void *in_RSI;
  void *in_RDI;
  word *in_R8;
  ec_o *in_R9;
  octet *stack;
  word *s1;
  word *s0;
  word *V;
  word *k;
  word *e;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff68;
  bign_params *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  octet *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  gen_i rng_00;
  word *c;
  word *a_00;
  bign_params *in_stack_ffffffffffffffa0;
  word *a_01;
  word *c_00;
  bign_deep_i in_stack_ffffffffffffffb8;
  word *b_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff70);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else {
      if ((in_RCX != (word *)0xffffffffffffffff) &&
         (sVar4 = oidFromDER(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78), sVar4 != 0xffffffffffffffff)) {
        if (s1 == (word *)0x0) {
          return 0x130;
        }
        bignStart_keep(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
        a = (word *)blobCreate((size_t)in_stack_ffffffffffffff68);
        if (a == (word *)0x0) {
          return 0x6e;
        }
        eVar2 = bignStart(a,in_stack_ffffffffffffffa0);
        if (eVar2 != 0) {
          blobClose((blob_t)0x14cbab);
          return eVar2;
        }
        b_00 = *(word **)(a[3] + 0x38);
        c_00 = *(word **)(a[3] + 0x30);
        a_01 = a;
        bVar1 = memIsValid(in_R8,(size_t)b_00);
        if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R9,(size_t)b_00), bVar1 != 0)) &&
            (bVar1 = memIsValid(stack,(size_t)b_00), bVar1 != 0)) &&
           (bVar1 = memIsValid(in_RDI,(long)b_00 + ((ulong)b_00 >> 1)), bVar1 != 0)) {
          mod = (word *)((long)a + *a);
          c = mod + (long)c_00;
          rng_00 = (gen_i)(c + (long)c_00);
          b = rng_00 + ((ulong)c_00 >> 1) * 8 + (long)c_00 * 8;
          dest = rng_00 + (long)c_00 * 0x10;
          a_00 = mod;
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x14ccfc);
          iVar3 = wwCmp(a_00,(word *)a[7],(size_t)c_00);
          if (-1 < iVar3) {
            blobClose((blob_t)0x14cd23);
            return 0x1f8;
          }
          bVar1 = zzRandNZMod(a,a_00,(size_t)c,rng_00,b);
          if (bVar1 == 0) {
            blobClose((blob_t)0x14cd6a);
            return 0x130;
          }
          bVar1 = ecMulA(in_RCX,in_R8,in_R9,(word *)CONCAT44(eVar2,in_stack_ffffffffffffffc0),
                         (size_t)b_00,c_00);
          if (bVar1 == 0) {
            blobClose((blob_t)0x14cdb0);
            return 0x1f6;
          }
          (**(code **)(a[3] + 0x48))(rng_00,rng_00,a[3],dest);
          beltHashStart(dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepG2((octet *)b,(size_t)mod,dest);
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x14ce75);
          zzMul(c_00,a_01,(size_t)a,a_00,(size_t)c,rng_00);
          wVar5 = zzAdd((word *)(rng_00 + ((ulong)c_00 >> 1) * 8),
                        (word *)(rng_00 + ((ulong)c_00 >> 1) * 8),a_00,(size_t)c_00);
          *(word *)(rng_00 + ((long)c_00 + ((ulong)c_00 >> 1)) * 8) = wVar5;
          zzMod(in_R8,(word *)in_R9,CONCAT44(eVar2,in_stack_ffffffffffffffc0),b_00,(size_t)c_00,a_01
               );
          zzSubMod(c,(word *)rng_00,(word *)b,mod,(size_t)dest);
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x14cf5a);
          zzSubMod(c,(word *)rng_00,(word *)b,mod,(size_t)dest);
          u64To(dest,(size_t)in_stack_ffffffffffffff68,(u64 *)0x14cf9e);
          blobClose((blob_t)0x14cfa8);
          return 0;
        }
        blobClose((blob_t)0x14cc54);
        return 0x6d;
      }
      local_4 = 0x12d;
    }
  }
  return local_4;
}

Assistant:

err_t bignIdSign(octet id_sig[], const bign_params* params, 
	const octet oid_der[], size_t oid_len, const octet id_hash[], 
	const octet hash[], const octet id_privkey[], gen_i rng, void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* e;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* V;				/* [2n] точка V */
	word* s0;				/* [n/2] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdSign_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(hash, no) ||
		!memIsValid(id_privkey, no) ||
		!memIsValid(id_sig, no + no / 2))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	e = s1 = objEnd(ec, word);
	k = e + n;
	V = k + n;
	s0 = V + n + n / 2;
	stack = (octet*)(V + 2 * n);
	// загрузить e
	wwFrom(e, id_privkey, no);
	if (wwCmp(e, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// сгенерировать k с помощью rng
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// V <- k G
	if (!ecMulA(V, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)V, ecX(V), ec->f, stack);
	// s0 <- belt-hash(oid || V || H0 || H) mod 2^l
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(V, no, stack);
	beltHashStepH(id_hash, no, stack);
	beltHashStepH(hash, no, stack);
	beltHashStepG2(id_sig, no / 2, stack);
	wwFrom(s0, id_sig, no / 2);
	// V <- (s0 + 2^l) e
	zzMul(V, s0, n / 2, e, n, stack);
	V[n + n / 2] = zzAdd(V + n / 2, V + n / 2, e, n);
	// s1 <- V mod q
	zzMod(s1, V, n + n / 2 + 1, ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, no);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(id_sig + no / 2, no, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}